

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O2

char * eat_name(char *p)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  do {
    while( true ) {
      bVar1 = *p;
      if ((char)bVar1 != 0x5c) break;
      p = scan_esc(p);
    }
    iVar2 = OPENSSL_isalnum((int)(char)bVar1);
    if (iVar2 == 0) {
      uVar3 = (uint)bVar1;
      if ((((0x3e < uVar3 - 0x21) ||
           ((0x60000000c4007e31U >> ((ulong)(uVar3 - 0x21) & 0x3f) & 1) == 0)) && (uVar3 != 0x7c))
         && (uVar3 != 0x7e)) {
        return (char *)(byte *)p;
      }
    }
    p = (char *)((byte *)p + 1);
  } while( true );
}

Assistant:

static char *eat_name(char *p) {
  for (;;) {
    if (is_esc(*p)) {
      p = scan_esc(p);
      continue;
    }
    if (!is_name_char(*p)) {
      return p;
    }
    p++;
  }
}